

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtio.c
# Opt level: O3

uint32_t virtio_rx_batch(ixy_device *ixy,uint16_t queue_id,pkt_buf **bufs,uint32_t num_bufs)

{
  uint32_t uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint uVar4;
  int iVar5;
  ulong in_RAX;
  undefined8 *puVar6;
  pkt_buf *ppVar7;
  ssize_t sVar8;
  undefined8 extraout_RAX;
  mempool *pmVar9;
  ulong uVar10;
  char *__addr;
  __off_t _Var11;
  undefined8 extraout_RAX_00;
  long *plVar12;
  uintptr_t uVar13;
  undefined8 extraout_RAX_01;
  long lVar14;
  ushort uVar15;
  ulong extraout_RDX;
  ulong uVar16;
  ulong extraout_RDX_00;
  undefined2 *unaff_RBP;
  undefined2 *puVar17;
  char cVar18;
  void *__buf;
  short *__buf_00;
  uint *puVar19;
  undefined4 *__buf_01;
  long lVar20;
  ushort *__buf_02;
  long *__buf_03;
  long *plVar21;
  long lVar22;
  ulong uVar23;
  uint *size;
  uint uVar24;
  undefined *unaff_R13;
  short sVar25;
  int iVar26;
  ulong uVar27;
  char *__s;
  ulong uVar28;
  ulong unaff_R15;
  dma_memory dVar29;
  undefined8 uVar30;
  long *plVar31;
  long alStack_1510 [66];
  ulong uStack_1300;
  char *pcStack_12f8;
  ulong uStack_12f0;
  code *pcStack_12e8;
  long alStack_12e0 [64];
  char acStack_10e0 [4096];
  ulong uStack_e0;
  char *pcStack_d8;
  undefined2 *puStack_d0;
  undefined2 *puStack_c8;
  ulong uStack_c0;
  ushort uStack_b2;
  undefined2 *puStack_b0;
  uint uStack_a8;
  short sStack_a2;
  undefined2 *puStack_a0;
  undefined4 uStack_94;
  ulong uStack_90;
  uint *puStack_88;
  undefined *puStack_80;
  mempool *pmStack_78;
  code *pcStack_68;
  undefined8 uStack_60;
  ixy_device *piStack_58;
  uint *puStack_50;
  ulong uStack_48;
  code *pcStack_40;
  undefined8 uStack_38;
  
  puVar19 = (uint *)ixy[1].driver_name;
  uStack_38 = in_RAX;
  if (num_bufs == 0) {
    uVar27 = 0;
  }
  else {
    uVar27 = 0;
    do {
      uVar15 = (ushort)puVar19[10];
      lVar14 = *(long *)(puVar19 + 6);
      if (uVar15 == *(ushort *)(lVar14 + 2)) goto LAB_00104f99;
      uVar28 = (ulong)uVar15 % (ulong)*puVar19;
      lVar22 = (ulong)*(uint *)(lVar14 + 4 + uVar28 * 8) * 0x10;
      *(ushort *)(puVar19 + 10) = uVar15 + 1;
      uVar15 = *(ushort *)(*(long *)(puVar19 + 2) + 0xc + lVar22);
      pmVar9 = (mempool *)(ulong)uVar15;
      if (uVar15 != 2) {
        pcStack_40 = (code *)0x105088;
        virtio_rx_batch_cold_1();
        goto LAB_00105088;
      }
      puVar6 = (undefined8 *)(*(long *)(puVar19 + 2) + lVar22);
      *puVar6 = 0;
      puVar6[1] = 0;
      uVar4 = *(uint *)(lVar14 + 8 + uVar28 * 8);
      ppVar7 = *(pkt_buf **)(puVar19 + (ulong)*(uint *)(lVar14 + 4 + uVar28 * 8) * 2 + 0xe);
      ppVar7->size = uVar4;
      bufs[uVar27] = ppVar7;
      ixy[1].set_promisc = ixy[1].set_promisc + uVar4;
      ixy[1].tx_batch = ixy[1].tx_batch + 1;
      uVar27 = uVar27 + 1;
    } while (num_bufs != uVar27);
    uVar27 = (ulong)num_bufs;
  }
LAB_00104f99:
  uVar4 = *puVar19;
  if (uVar4 != 0) {
    unaff_RBP = (undefined2 *)0x0;
    unaff_R13 = (undefined *)0x0;
    do {
      lVar14 = *(long *)(puVar19 + 2);
      unaff_R15 = (ulong)unaff_R13 & 0xffff;
      if (*(long *)(lVar14 + (ulong)(uint)((int)unaff_R15 << 4)) == 0) {
        pmVar9 = *(mempool **)(puVar19 + 0xc);
        pcStack_40 = (code *)0x104fce;
        ppVar7 = pkt_buf_alloc(pmVar9);
        num_bufs = (uint32_t)lVar14;
        if (ppVar7 == (pkt_buf *)0x0) goto LAB_00105088;
        uVar1 = *(uint32_t *)(*(long *)(puVar19 + 0xc) + 8);
        ppVar7->size = uVar1;
        ppVar7->head_room[0x25] = '\0';
        ppVar7->head_room[0x26] = '\0';
        ppVar7->head_room[0x1d] = '\0';
        ppVar7->head_room[0x1e] = '\0';
        ppVar7->head_room[0x1f] = '*';
        ppVar7->head_room[0x20] = '\0';
        ppVar7->head_room[0x21] = '\0';
        ppVar7->head_room[0x22] = '\0';
        ppVar7->head_room[0x23] = '\0';
        ppVar7->head_room[0x24] = '\0';
        lVar14 = *(long *)(puVar19 + 2);
        uVar28 = (ulong)(uint)((int)unaff_R15 << 4);
        *(uint32_t *)(lVar14 + 8 + uVar28) = uVar1 + 10;
        *(uintptr_t *)(lVar14 + uVar28) = ppVar7->buf_addr_phy + 0x36;
        *(undefined4 *)(lVar14 + 0xc + uVar28) = 2;
        *(pkt_buf **)(puVar19 + unaff_R15 * 2 + 0xe) = ppVar7;
        *(short *)(*(long *)(puVar19 + 4) + 4 +
                  ((ulong)*(ushort *)(*(long *)(puVar19 + 4) + 2) % (ulong)*puVar19) * 2) =
             (short)unaff_R13;
        *(short *)(*(long *)(puVar19 + 4) + 2) = *(short *)(*(long *)(puVar19 + 4) + 2) + 1;
        pmVar9 = (mempool *)(ulong)*(uint *)&ixy[1].pci_addr;
        uStack_38 = uStack_38 & 0xffffffffffff;
        num_bufs = 0x10;
        pcStack_40 = (code *)0x105058;
        sVar8 = pwrite(*(uint *)&ixy[1].pci_addr,(void *)((long)&uStack_38 + 6),2,0x10);
        if (sVar8 != 2) goto LAB_0010508d;
        uVar4 = *puVar19;
      }
      uVar24 = (int)unaff_R13 + 1;
      unaff_R13 = (undefined *)(ulong)uVar24;
    } while ((uVar24 & 0xffff) < uVar4);
  }
  return (uint32_t)uVar27;
LAB_00105088:
  pcStack_40 = (code *)0x10508d;
  virtio_rx_batch_cold_3();
LAB_0010508d:
  pcStack_40 = virtio_tx_batch;
  virtio_rx_batch_cold_2();
  size = *(uint **)&pmVar9[3].buf_size;
  uVar28 = (ulong)num_bufs;
  uStack_60 = extraout_RAX;
  piStack_58 = ixy;
  puStack_50 = puVar19;
  uStack_48 = uVar27;
  pcStack_40 = (code *)unaff_R15;
  while( true ) {
    if ((ushort)size[10] == *(ushort *)(*(long *)(size + 6) + 2)) break;
    lVar14 = *(long *)(size + 2);
    uVar27 = (ulong)*(uint *)(*(long *)(size + 6) + 4 + ((ulong)(ushort)size[10] % (ulong)*size) * 8
                             );
    lVar22 = uVar27 * 0x10;
    *(undefined8 *)(lVar14 + lVar22) = 0;
    *(undefined4 *)(lVar14 + 8 + lVar22) = 0;
    pcStack_68 = (code *)0x1050ed;
    pkt_buf_free(*(pkt_buf **)(size + uVar27 * 2 + 0xe));
    *(short *)(size + 10) = (short)size[10] + 1;
  }
  if (num_bufs == 0) {
    uVar28 = 0;
  }
  else {
    uVar27 = 0;
    uVar15 = 0;
    do {
      uVar4 = *size;
      uVar24 = (uint)uVar15;
      if (uVar24 < uVar4) {
        lVar14 = *(long *)(*(long *)(size + 2) + (ulong)uVar15 * 0x10);
        while (lVar14 != 0) {
          uVar15 = uVar15 + 1;
          uVar24 = (uint)uVar15;
          if (uVar4 <= uVar24) break;
          lVar14 = *(long *)(*(long *)(size + 2) + (ulong)uVar15 * 0x10);
        }
      }
      if (uVar4 == uVar24) {
        uVar28 = uVar27 & 0xffffffff;
        break;
      }
      plVar12 = *(long **)(extraout_RDX + uVar27 * 8);
      uVar4 = *(uint *)((long)plVar12 + 0x14);
      pmVar9[5].base_addr = (void *)((long)pmVar9[5].base_addr + (ulong)uVar4);
      *(long *)&pmVar9[4].buf_size = *(long *)&pmVar9[4].buf_size + 1;
      *(long **)(size + (ulong)uVar15 * 2 + 0xe) = plVar12;
      *(undefined2 *)((long)plVar12 + 0x3e) = 0;
      *(undefined8 *)((long)plVar12 + 0x36) = 0x2a0000;
      lVar14 = *(long *)(size + 2);
      lVar22 = (ulong)uVar15 * 0x10;
      *(uint *)(lVar14 + 8 + lVar22) = uVar4 + 10;
      *(long *)(lVar14 + lVar22) = *plVar12 + 0x36;
      *(undefined4 *)(lVar14 + 0xc + lVar22) = 0;
      *(ushort *)(*(long *)(size + 4) + 4 + (ulong)uVar15 * 2) = uVar15;
      uVar27 = uVar27 + 1;
    } while (uVar27 != uVar28);
  }
  *(short *)(*(long *)(size + 4) + 2) = *(short *)(*(long *)(size + 4) + 2) + (short)uVar28;
  uVar27 = (ulong)pmVar9[2].free_stack_top;
  __buf = (void *)((long)&uStack_60 + 6);
  uStack_60 = CONCAT26(1,(undefined6)uStack_60);
  pcStack_68 = (code *)0x1051e5;
  sVar8 = pwrite(pmVar9[2].free_stack_top,__buf,2,0x10);
  if (sVar8 == 2) {
    return (uint32_t)uVar28;
  }
  pcStack_68 = virtio_legacy_setup_tx_queue;
  virtio_tx_batch_cold_1();
  __s = (char *)((ulong)__buf & 0xffffffff);
  uStack_90 = uVar28;
  puStack_88 = size;
  puStack_80 = unaff_R13;
  pmStack_78 = pmVar9;
  pcStack_68 = (code *)unaff_RBP;
  if ((ushort)((short)__buf - 3U) < 0xfffe) {
    puStack_d0 = (undefined2 *)0x1054d5;
    virtio_legacy_setup_tx_queue_cold_5();
    cVar18 = (char)__buf;
    uVar10 = uVar27;
LAB_001054d5:
    puStack_d0 = (undefined2 *)0x1054da;
    virtio_legacy_setup_tx_queue_cold_1();
LAB_001054da:
    puStack_d0 = (undefined2 *)0x1054df;
    virtio_legacy_setup_tx_queue_cold_2();
    uVar16 = extraout_RDX;
LAB_001054df:
    puStack_d0 = (undefined2 *)0x1054e4;
    virtio_legacy_setup_tx_queue_cold_3();
  }
  else {
    uVar10 = (ulong)*(uint *)(uVar27 + 0x40);
    __buf_00 = &sStack_a2;
    sVar25 = (short)__s;
    puStack_d0 = (undefined2 *)0x10523b;
    sStack_a2 = sVar25;
    sVar8 = pwrite(*(uint *)(uVar27 + 0x40),__buf_00,2,0xe);
    cVar18 = (char)__buf_00;
    uVar28 = uVar27;
    if (sVar8 != 2) goto LAB_001054d5;
    uVar10 = (ulong)*(uint *)(uVar27 + 0x40);
    puVar19 = &uStack_a8;
    puStack_d0 = (undefined2 *)0x10525c;
    sVar8 = pread(*(uint *)(uVar27 + 0x40),puVar19,4,0xc);
    cVar18 = (char)puVar19;
    if (sVar8 != 4) goto LAB_001054da;
    uVar16 = (ulong)uStack_a8;
    unaff_R13 = &stderr;
    puStack_c8 = (undefined2 *)CONCAT44(puStack_c8._4_4_,uStack_a8);
    puStack_d0 = (undefined2 *)0x10529f;
    uVar4 = fprintf(_stderr,"[DEBUG] %s:%d %s(): Max queue size of tx queue #%u: %u\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/Yumasi[P]ixy-vswitch/extern/ixy/src/driver/virtio.c"
                    ,0x36,"virtio_legacy_setup_tx_queue",(ulong)__buf & 0xffff);
    uVar10 = (ulong)uVar4;
    if (uVar16 == 0) goto LAB_001052a4;
    size = (uint *)((uVar16 * 0x12 + 0x1003 & 0xfffffffffffff000) + uVar16 * 8 + 4);
    puStack_d0 = (undefined2 *)0x1052da;
    dVar29 = memory_allocate_dma((size_t)size,true);
    puStack_b0 = (undefined2 *)dVar29.phy;
    unaff_RBP = (undefined2 *)dVar29.virt;
    puStack_d0 = (undefined2 *)0x1052f2;
    memset(unaff_RBP,0xab,(size_t)size);
    puStack_d0 = (undefined2 *)0x105323;
    puStack_c8 = unaff_RBP;
    puStack_a0 = unaff_RBP;
    fprintf(_stderr,"[DEBUG] %s:%d %s(): Allocated %zu bytes for virt queue at %p\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/Yumasi[P]ixy-vswitch/extern/ixy/src/driver/virtio.c"
            ,0x3d,"virtio_legacy_setup_tx_queue");
    uVar10 = (ulong)*(uint *)(uVar27 + 0x40);
    __buf_01 = &uStack_94;
    uStack_94 = (undefined4)((ulong)puStack_b0 >> 0xc);
    puStack_d0 = (undefined2 *)0x105345;
    sVar8 = pwrite(*(uint *)(uVar27 + 0x40),__buf_01,4,8);
    cVar18 = (char)__buf_01;
    if (sVar8 != 4) goto LAB_001054df;
    puStack_d0 = (undefined2 *)0x105365;
    size = (uint *)calloc(1,uVar16 * 8 + 0x38);
    *size = uStack_a8;
    *(undefined2 **)(size + 2) = puStack_a0;
    puStack_c8 = puStack_a0 + uVar16 * 8;
    *(undefined2 **)(size + 4) = puStack_c8;
    uStack_c0 = (long)puStack_c8 + uVar16 * 2 + 0x1003 & 0xfffffffffffff000;
    *(ulong *)(size + 6) = uStack_c0;
    puStack_d0 = (undefined2 *)0x1053c8;
    fprintf(_stderr,"[DEBUG] %s:%d %s(): vring desc: %p, vring avail: %p, vring used: %p\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/Yumasi[P]ixy-vswitch/extern/ixy/src/driver/virtio.c"
            ,0x43,"virtio_legacy_setup_tx_queue");
    uVar4 = *size;
    unaff_RBP = *(undefined2 **)(size + 6);
    if ((ulong)uVar4 != 0) {
      lVar14 = *(long *)(size + 2);
      lVar22 = *(long *)(size + 4);
      lVar20 = 0;
      do {
        puVar6 = (undefined8 *)(lVar14 + lVar20 * 8);
        *puVar6 = 0;
        puVar6[1] = 0;
        *(undefined2 *)(lVar22 + 4 + lVar20) = 0;
        *(undefined8 *)(unaff_RBP + lVar20 * 2 + 2) = 0;
        lVar20 = lVar20 + 2;
      } while ((ulong)uVar4 * 2 != lVar20);
    }
    unaff_RBP[1] = 0;
    puStack_b0 = *(undefined2 **)(size + 4);
    puStack_b0[1] = 0;
    *(undefined2 *)(size + 10) = 0;
    uVar10 = (ulong)*(uint *)(uVar27 + 0x40);
    __buf_02 = &uStack_b2;
    puStack_d0 = (undefined2 *)0x105438;
    sVar8 = pread(*(uint *)(uVar27 + 0x40),__buf_02,2,0x10);
    cVar18 = (char)__buf_02;
    if (sVar8 == 2) {
      puStack_d0 = (undefined2 *)0x105472;
      fprintf(_stderr,"[DEBUG] %s:%d %s(): vq notifcation offset %u\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/Yumasi[P]ixy-vswitch/extern/ixy/src/driver/virtio.c"
              ,0x53,"virtio_legacy_setup_tx_queue",(ulong)uStack_b2);
      *(ulong *)(size + 8) = (ulong)uStack_b2;
      if (sVar25 == 2) {
        puStack_d0 = (undefined2 *)0x10548b;
        pmVar9 = memory_allocate_mempool(uStack_a8,0x800);
        *(mempool **)(size + 0xc) = pmVar9;
        **(undefined2 **)(size + 4) = 1;
        **(undefined2 **)(size + 6) = 0;
LAB_001054c2:
        uVar10 = 0x58;
      }
      else {
        *puStack_b0 = 1;
        *unaff_RBP = 0;
        uVar10 = 0x50;
        if (sVar25 != 1) goto LAB_001054c2;
      }
      *(uint **)(uVar27 + uVar10) = size;
LAB_001052a4:
      return (uint32_t)uVar10;
    }
  }
  puStack_d0 = (undefined2 *)0x1054e9;
  virtio_legacy_setup_tx_queue_cold_4();
  uVar1 = huge_pg_id;
  plVar12 = alStack_12e0;
  uVar27 = uVar10 + 0x1fffff & 0xffffffffffe00000;
  uStack_e0 = uVar28;
  pcStack_d8 = __s;
  puStack_d0 = unaff_RBP;
  if (uVar27 < 0x200001 || cVar18 != '\x01') {
    LOCK();
    puVar17 = (undefined2 *)(ulong)huge_pg_id;
    UNLOCK();
    pcStack_12e8 = (code *)0x105531;
    huge_pg_id = huge_pg_id + 1;
    uVar4 = getpid();
    __s = acStack_10e0;
    pcStack_12e8 = (code *)0x105554;
    snprintf(__s,0x1000,"/mnt/huge/ixy-%d-%d",(ulong)uVar4,(ulong)uVar1);
    pcStack_12e8 = (code *)0x105568;
    uVar4 = open(__s,0x42,0x1c0);
    unaff_RBP = puVar17;
    if (uVar4 == 0xffffffff) goto LAB_001055e4;
    unaff_RBP = (undefined2 *)(ulong)uVar4;
    pcStack_12e8 = (code *)0x105579;
    iVar5 = ftruncate(uVar4,uVar27);
    if (iVar5 == -1) goto LAB_001055ec;
    pcStack_12e8 = (code *)0x105598;
    __addr = (char *)mmap((void *)0x0,uVar27,3,0x40001,uVar4,0);
    if (__addr == (char *)0xffffffffffffffff) goto LAB_001055f4;
    pcStack_12e8 = (code *)0x1055ac;
    iVar5 = mlock(__addr,uVar27);
    if (iVar5 != -1) {
      pcStack_12e8 = (code *)0x1055b8;
      close(uVar4);
      pcStack_12e8 = (code *)0x1055c5;
      unlink(acStack_10e0);
      pcStack_12e8 = (code *)0x1055cd;
      virt_to_phys(__addr);
      return (uint32_t)__addr;
    }
  }
  else {
    pcStack_12e8 = (code *)0x1055e4;
    memory_allocate_dma_cold_5();
LAB_001055e4:
    pcStack_12e8 = (code *)0x1055ec;
    memory_allocate_dma_cold_4();
LAB_001055ec:
    pcStack_12e8 = (code *)0x1055f4;
    memory_allocate_dma_cold_3();
LAB_001055f4:
    __addr = __s;
    pcStack_12e8 = (code *)0x1055fc;
    memory_allocate_dma_cold_2();
  }
  pcStack_12e8 = virt_to_phys;
  memory_allocate_dma_cold_1();
  uStack_1300 = uVar27;
  pcStack_12f8 = __addr;
  uStack_12f0 = uVar16;
  pcStack_12e8 = (code *)unaff_RBP;
  uVar27 = sysconf(0x1e);
  __buf_03 = (long *)0x0;
  uVar4 = open("/proc/self/pagemap",0);
  if (uVar4 == 0xffffffff) {
    virt_to_phys_cold_4();
LAB_001056b2:
    virt_to_phys_cold_3();
  }
  else {
    unaff_RBP = (undefined2 *)(ulong)uVar4;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar27;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = plVar12;
    uVar16 = SUB168(auVar3 % auVar2,0);
    __buf_03 = (long *)(((ulong)plVar12 / uVar27) * 8);
    _Var11 = lseek(uVar4,(__off_t)__buf_03,0);
    if (_Var11 == -1) goto LAB_001056b2;
    __buf_03 = alStack_1510;
    alStack_1510[0] = 0;
    sVar8 = read(uVar4,__buf_03,8);
    if (sVar8 != -1) {
      close(uVar4);
      if (alStack_1510[0] != 0) {
        return SUB164(auVar3 % auVar2,0) + (int)alStack_1510[0] * (int)uVar27;
      }
      goto LAB_001056c6;
    }
  }
  virt_to_phys_cold_2();
LAB_001056c6:
  plVar21 = plVar12;
  virt_to_phys_cold_1();
  uVar28 = 0x800;
  if ((int)__buf_03 != 0) {
    uVar28 = (ulong)__buf_03 & 0xffffffff;
  }
  if ((int)(0x200000 % uVar28) == 0) {
    iVar5 = (int)plVar21;
    plVar12 = (long *)malloc(((ulong)plVar21 & 0xffffffff) * 4 + 0x18);
    iVar26 = (int)uVar28;
    uVar4 = 0;
    dVar29 = memory_allocate_dma((ulong)(uint)(iVar26 * iVar5),false);
    *(int *)((long)plVar12 + 0xc) = iVar5;
    *(int *)(plVar12 + 1) = iVar26;
    *plVar12 = (long)dVar29.virt;
    *(int *)(plVar12 + 2) = iVar5;
    if (iVar5 != 0) {
      uVar27 = 0;
      do {
        *(int *)((long)plVar12 + uVar27 * 4 + 0x14) = (int)uVar27;
        lVar14 = *plVar12;
        uVar28 = (ulong)uVar4;
        uVar13 = virt_to_phys((void *)(uVar28 + lVar14));
        *(uintptr_t *)(lVar14 + uVar28) = uVar13;
        *(int *)(lVar14 + 0x10 + uVar28) = (int)uVar27;
        *(long **)(lVar14 + 8 + uVar28) = plVar12;
        *(undefined4 *)(lVar14 + 0x14 + uVar28) = 0;
        uVar27 = uVar27 + 1;
        uVar4 = uVar4 + iVar26;
      } while (((ulong)plVar21 & 0xffffffff) != uVar27);
    }
    return (uint32_t)plVar12;
  }
  uVar30 = extraout_RAX_00;
  plVar31 = plVar12;
  memory_allocate_mempool_cold_1();
  uVar23 = extraout_RDX_00 & 0xffffffff;
  uVar4 = *(uint *)(plVar21 + 2);
  uVar10 = (ulong)uVar4;
  if (uVar4 < (uint)extraout_RDX_00) {
    fprintf(_stderr,"[WARN ] %s:%d %s(): memory pool %p only has %d free bufs, requested %d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/Yumasi[P]ixy-vswitch/extern/ixy/src/memory.c"
            ,0x5f,"pkt_buf_alloc_batch",plVar21,(ulong)uVar4,uVar23,extraout_RAX_01,plVar12,uVar28,
            uVar30,plVar31,size,unaff_R13,uVar27,uVar16,unaff_RBP);
    uVar23 = (ulong)*(uint *)(plVar21 + 2);
    uVar10 = uVar23;
  }
  if ((uint32_t)uVar23 != 0) {
    lVar14 = plVar21[1];
    lVar22 = 0;
    do {
      uVar4 = (int)uVar10 - 1;
      uVar10 = (ulong)uVar4;
      *(ulong *)((long)__buf_03 + lVar22) =
           (ulong)(uint)(*(int *)((long)plVar21 + uVar10 * 4 + 0x14) * (int)lVar14) + *plVar21;
      lVar22 = lVar22 + 8;
    } while (uVar23 << 3 != lVar22);
    *(uint *)(plVar21 + 2) = uVar4;
  }
  return (uint32_t)uVar23;
}

Assistant:

uint32_t virtio_rx_batch(struct ixy_device* ixy, uint16_t queue_id, struct pkt_buf* bufs[], uint32_t num_bufs) {
	struct virtio_device* dev = IXY_TO_VIRTIO(ixy);
	struct virtqueue* vq = dev->rx_queue;
	uint32_t buf_idx;

	_mm_mfence();
	// Retrieve used bufs from the device
	for (buf_idx = 0; buf_idx < num_bufs; ++buf_idx) {
		// Section 3.2.2
		if (vq->vq_used_last_idx == vq->vring.used->idx) {
			break;
		}
		// info("Rx packet: last used %u, used idx %u", vq->vq_used_last_idx,
		// vq->vring.used->idx);
		struct vring_used_elem* e = vq->vring.used->ring + (vq->vq_used_last_idx % vq->vring.num);
		// info("Used elem %p, id %u len %u", e, e->id, e->len);
		struct vring_desc* desc = &vq->vring.desc[e->id];
		vq->vq_used_last_idx++;
		// We don't support chaining or indirect descriptors
		if (desc->flags != VRING_DESC_F_WRITE) {
			error("unsupported rx flags on descriptor: %x", desc->flags);
		}
		// info("Desc %lu %u %u %u", desc->addr, desc->len, desc->flags,
		// desc->next);
		*desc = (struct vring_desc){};

		// Section 5.1.6.4
		struct pkt_buf* buf = vq->virtual_addresses[e->id];
		buf->size = e->len;
		bufs[buf_idx] = buf;
		//struct virtio_net_hdr* hdr = (void*)(buf->head_room + sizeof(buf->head_room) - sizeof(net_hdr));

		// Update rx counter
		dev->rx_bytes += buf->size;
		dev->rx_pkts++;
	}
	// Fill empty slots in desciptor table
	for (uint16_t idx = 0; idx < vq->vring.num; ++idx) {
		struct vring_desc* desc = &vq->vring.desc[idx];
		if (desc->addr != 0) { // descriptor points to something, therefore it is in use
			continue;
		}
		// info("Found free desc slot at %u (%u)", idx, vq->vring.num);
		struct pkt_buf* buf = pkt_buf_alloc(vq->mempool);
		if (!buf) {
			error("failed to allocate new mbuf for rx, you are either leaking memory or your mempool is too small");
		}
		buf->size = vq->mempool->buf_size;
		memcpy(buf->head_room + sizeof(buf->head_room) - sizeof(net_hdr), &net_hdr, sizeof(net_hdr));
		vq->vring.desc[idx].len = buf->size + sizeof(net_hdr);
		vq->vring.desc[idx].addr =
		    buf->buf_addr_phy + offsetof(struct pkt_buf, head_room) + sizeof(buf->head_room) - sizeof(net_hdr);
		vq->vring.desc[idx].flags = VRING_DESC_F_WRITE;
		vq->vring.desc[idx].next = 0;
		vq->virtual_addresses[idx] = buf;
		vq->vring.avail->ring[vq->vring.avail->idx % vq->vring.num] = idx;
		_mm_mfence(); // Make sure exposed descriptors reach device before index is updated
		vq->vring.avail->idx++;
		_mm_mfence(); // Make sure the index update reaches device before it is triggered
		virtio_legacy_notify_queue(dev, 0);
	}
	return buf_idx;
}